

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O1

int auxupvalue(lua_State *L,int get)

{
  lua_Integer lVar1;
  char *s;
  int iVar2;
  
  lVar1 = luaL_checkinteger(L,2);
  luaL_checktype(L,1,6);
  if (get == 0) {
    s = lua_setupvalue(L,1,(int)lVar1);
  }
  else {
    s = lua_getupvalue(L,1,(int)lVar1);
  }
  if (s == (char *)0x0) {
    iVar2 = 0;
  }
  else {
    lua_pushstring(L,s);
    iVar2 = get + 1;
    lua_rotate(L,~get,1);
  }
  return iVar2;
}

Assistant:

static int auxupvalue(lua_State *L, int get) {
    const char *name;
    int n = (int) luaL_checkinteger(L, 2);  /* upvalue index */
    luaL_checktype(L, 1, LUA_TFUNCTION);  /* closure */
    name = get ? lua_getupvalue(L, 1, n) : lua_setupvalue(L, 1, n);
    if (name == NULL) return 0;
    lua_pushstring(L, name);
    lua_insert(L, -(get + 1));  /* no-op if get is false */
    return get + 1;
}